

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O2

void google::protobuf::compiler::cpp::GenerateSerializationLoop
               (Formatter *format,bool string_key,bool string_value,bool is_deterministic)

{
  undefined3 in_register_00000009;
  string ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  if (CONCAT31(in_register_00000009,is_deterministic) == 0) {
    Formatter::operator()<>
              (format,
               "for (::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_iterator\n    it = this->_internal_$name$().begin();\n    it != this->_internal_$name$().end(); ++it) {\n"
              );
  }
  else {
    Formatter::operator()<>(format,"for (size_type i = 0; i < n; i++) {\n");
  }
  std::__cxx11::string::assign((char *)&local_38);
  Formatter::Indent(format);
  Formatter::operator()
            (format,
             "target = $map_classname$::Funcs::InternalSerialize($number$, $1$->first, $1$->second, target, stream);\n"
             ,&local_38);
  if (string_key || string_value) {
    Formatter::operator()(format,"Utf8Check::Check(&(*$1$));\n",&local_38);
  }
  Formatter::Outdent(format);
  Formatter::operator()<>(format,"}\n");
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void GenerateSerializationLoop(const Formatter& format, bool string_key,
                                      bool string_value,
                                      bool is_deterministic) {
  std::string ptr;
  if (is_deterministic) {
    format("for (size_type i = 0; i < n; i++) {\n");
    ptr = string_key ? "items[static_cast<ptrdiff_t>(i)]"
                     : "items[static_cast<ptrdiff_t>(i)].second";
  } else {
    format(
        "for (::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
        "    it = this->_internal_$name$().begin();\n"
        "    it != this->_internal_$name$().end(); ++it) {\n");
    ptr = "it";
  }
  format.Indent();

  format(
      "target = $map_classname$::Funcs::InternalSerialize($number$, "
      "$1$->first, $1$->second, target, stream);\n",
      ptr);

  if (string_key || string_value) {
    // ptr is either an actual pointer or an iterator, either way we can
    // create a pointer by taking the address after de-referencing it.
    format("Utf8Check::Check(&(*$1$));\n", ptr);
  }

  format.Outdent();
  format("}\n");
}